

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

bool __thiscall
QHttpHeaders::insert(QHttpHeaders *this,qsizetype i,WellKnownHeader name,QAnyStringView value)

{
  QHttpHeadersPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  _Variadic_union<QHttpHeaders::WellKnownHeader,_QByteArray> local_70;
  undefined1 local_58;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValidHttpHeaderValueField(value);
  if (bVar2) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(&this->d);
    pQVar1 = (this->d).d.ptr;
    local_58 = 0;
    local_70._M_first._M_storage = (_Uninitialized<QHttpHeaders::WellKnownHeader,_true>)name;
    normalizedValue(&local_50,value);
    QList<Header>::emplace<Header>(&pQVar1->headers,i,(Header *)&local_70._M_first);
    Header::~Header((Header *)&local_70._M_first);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::insert(qsizetype i, WellKnownHeader name, QAnyStringView value)
{
    verify(i, 0);
    if (!isValidHttpHeaderValueField(value))
        return false;

    d.detach();
    d->headers.insert(i, {HeaderName{name}, normalizedValue(value)});
    return true;
}